

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_out.cc
# Opt level: O2

bool rcg::printNodemap(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *root,int depth,
                      bool show_enum_list)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator local_71;
  string local_70 [2];
  INode *node;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_70,root);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_70);
  node = (INode *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_70);
  if (node != (INode *)0x0) {
    std::__cxx11::string::string((string *)local_70,"  ",&local_71);
    printNode(local_70,node,depth,show_enum_list);
    std::__cxx11::string::~string((string *)local_70);
  }
  return node != (INode *)0x0;
}

Assistant:

bool printNodemap(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char root[],
  int depth, bool show_enum_list)
{
  GenApi::INode *p=nodemap->_GetNode(root);
  bool ret=false;

  if (p)
  {
    printNode(std::string("  "), p, depth, show_enum_list);
    ret=true;
  }

  return ret;
}